

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_0::ClassVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Descriptor *desc,Options *opts)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  reference ppVar5;
  Options *in_RCX;
  Options *pOVar6;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  Descriptor *desc_00;
  long lVar7;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  undefined1 local_a7b [2];
  allocator<char> local_a79;
  allocator<char> local_a78;
  allocator<char> local_a77;
  allocator<char> local_a76;
  allocator<char> local_a75;
  allocator<char> local_a74;
  allocator<char> local_a73;
  allocator<char> local_a72;
  allocator<char> local_a71;
  Options *local_a70;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *local_a68;
  string local_a60;
  string local_a40;
  string local_a20;
  iterator __begin3;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  Sub local_7f0;
  string local_738;
  string local_718;
  AlphaNum local_6f8;
  basic_string_view<char,_std::char_traits<char>_> local_6c8;
  basic_string_view<char,_std::char_traits<char>_> local_6b8;
  Sub local_6a8 [4];
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  local_a68 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"pkg",&local_a71);
  local_a70 = opts;
  Namespace_abi_cxx11_(&local_a40,(cpp *)desc,(Descriptor *)opts,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_6a8,&local_810,&local_a40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"Msg",&local_a72);
  ClassName_abi_cxx11_(&local_850,(cpp *)desc,descriptor);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_6a8 + 1,&local_830,&local_850);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"pkg::Msg",&local_a73);
  QualifiedClassName_abi_cxx11_(&local_890,(cpp *)desc,(Descriptor *)local_a70,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_6a8 + 2,&local_870,&local_890);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b0,"pkg.Msg",&local_a74);
  pcVar1 = (desc->all_names_).payload_;
  local_6b8._M_len = (size_t)*(ushort *)(pcVar1 + 2);
  pOVar6 = (Options *)(pcVar1 + ~local_6b8._M_len);
  local_6b8._M_str = (char *)pOVar6;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (local_6a8 + 3,&local_8b0,&local_6b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"classname",&local_a75);
  ClassName_abi_cxx11_(&local_8f0,(cpp *)desc,descriptor_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_8d0,&local_8f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"classtype",&local_a76);
  QualifiedClassName_abi_cxx11_(&local_930,(cpp *)desc,(Descriptor *)local_a70,pOVar6);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_910,&local_930);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_950,"full_name",&local_a77);
  pcVar1 = (desc->all_names_).payload_;
  local_6c8._M_len = (size_t)*(ushort *)(pcVar1 + 2);
  pOVar6 = (Options *)(pcVar1 + ~local_6c8._M_len);
  local_6c8._M_str = (char *)pOVar6;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_258,&local_950,&local_6c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_970,"superclass",&local_a78);
  SuperClassName_abi_cxx11_(&local_990,(cpp *)desc,(Descriptor *)local_a70,pOVar6);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_970,&local_990);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"WeakDescriptorSelfPin",&local_a79);
  bVar4 = UsingImplicitWeakDescriptor(desc->file_,local_a70);
  if (bVar4) {
    StrongReferenceToType_abi_cxx11_(&local_a60,(cpp *)desc,(Descriptor *)local_a70,pOVar6);
    local_6f8.piece_ = absl::lts_20250127::NullSafeStringView(";");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a20,(lts_20250127 *)&__begin3,&local_6f8,&local_6f8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a20,"",(allocator<char> *)&local_a60);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_7f0,&local_9b0,&local_a20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d0,";",(allocator<char> *)(local_a7b + 1));
  io::Printer::Sub::WithSuffix(&local_e8,&local_7f0,&local_9d0);
  pOVar6 = (Options *)local_a7b;
  __l._M_len = 9;
  __l._M_array = local_6a8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(local_a68,__l,(allocator_type *)pOVar6);
  lVar7 = 0x5c0;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_6a8[0].key_._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0xb8;
  } while (lVar7 != -0xb8);
  std::__cxx11::string::~string((string *)&local_9d0);
  io::Printer::Sub::~Sub(&local_7f0);
  std::__cxx11::string::~string((string *)&local_a20);
  if (bVar4) {
    std::__cxx11::string::~string((string *)&local_a60);
  }
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_810);
  MessageVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_7f0,(cpp *)desc,desc_00);
  __begin3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_7f0);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_7f0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_6f8.piece_._M_str;
  local_6f8.piece_ = (string_view)(auVar2 << 0x40);
  while( true ) {
    bVar4 = absl::lts_20250127::container_internal::operator!=(&__begin3,(iterator *)&local_6f8);
    if (!bVar4) break;
    ppVar5 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*(&__begin3);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_718,&ppVar5->first,(allocator<char> *)&local_a40);
    io::Printer::Sub::Sub<std::__cxx11::string&>(local_6a8,&local_718,&ppVar5->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::emplace_back<google::protobuf::io::Printer::Sub>(local_a68,local_6a8);
    io::Printer::Sub::~Sub(local_6a8);
    std::__cxx11::string::~string((string *)&local_718);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(&__begin3);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_7f0);
  UnknownFieldsVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_7f0,(cpp *)desc,(Descriptor *)local_a70,pOVar6);
  __begin3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_7f0);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_7f0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_6f8.piece_._M_str;
  local_6f8.piece_ = (string_view)(auVar3 << 0x40);
  while( true ) {
    bVar4 = absl::lts_20250127::container_internal::operator!=(&__begin3,(iterator *)&local_6f8);
    if (!bVar4) break;
    ppVar5 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*(&__begin3);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_738,&ppVar5->first,(allocator<char> *)&local_a40);
    io::Printer::Sub::Sub<std::__cxx11::string&>(local_6a8,&local_738,&ppVar5->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::emplace_back<google::protobuf::io::Printer::Sub>(local_a68,local_6a8);
    io::Printer::Sub::~Sub(local_6a8);
    std::__cxx11::string::~string((string *)&local_738);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(&__begin3);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_7f0);
  return local_a68;
}

Assistant:

std::vector<Sub> ClassVars(const Descriptor* desc, Options opts) {
  std::vector<Sub> vars = {
      {"pkg", Namespace(desc, opts)},
      {"Msg", ClassName(desc, false)},
      {"pkg::Msg", QualifiedClassName(desc, opts)},
      {"pkg.Msg", desc->full_name()},

      // Old-style names, to be removed once all usages are gone in this and
      // other files.
      {"classname", ClassName(desc, false)},
      {"classtype", QualifiedClassName(desc, opts)},
      {"full_name", desc->full_name()},
      {"superclass", SuperClassName(desc, opts)},

      Sub("WeakDescriptorSelfPin",
          UsingImplicitWeakDescriptor(desc->file(), opts)
              ? absl::StrCat(StrongReferenceToType(desc, opts), ";")
              : "")
          .WithSuffix(";"),
  };

  for (auto& pair : MessageVars(desc)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  for (auto& pair : UnknownFieldsVars(desc, opts)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  return vars;
}